

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_timer.c
# Opt level: O2

uint64_t amqp_get_monotonic_timestamp(void)

{
  int iVar1;
  uint64_t uVar2;
  timespec tp;
  
  iVar1 = clock_gettime(1,(timespec *)&tp);
  if (iVar1 == -1) {
    uVar2 = 0;
  }
  else {
    uVar2 = tp.tv_sec * 1000000000 + tp.tv_nsec;
  }
  return uVar2;
}

Assistant:

uint64_t
amqp_get_monotonic_timestamp(void)
{
#ifdef __hpux
  return (uint64_t)gethrtime();
#else
  struct timespec tp;
  if (-1 == clock_gettime(CLOCK_MONOTONIC, &tp)) {
    return 0;
  }

  return ((uint64_t)tp.tv_sec * AMQP_NS_PER_S + (uint64_t)tp.tv_nsec);
#endif
}